

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O0

void handle_parent(session_t *sess)

{
  char cVar1;
  int iVar2;
  passwd *ppVar3;
  char cmd;
  passwd *pw;
  session_t *sess_local;
  
  ppVar3 = getpwnam("nobody");
  if (ppVar3 == (passwd *)0x0) {
    return;
  }
  iVar2 = setegid(ppVar3->pw_gid);
  if (-1 < iVar2) {
    iVar2 = seteuid(ppVar3->pw_uid);
    if (-1 < iVar2) {
      minimize_privilege();
      do {
        cVar1 = priv_sock_get_cmd(sess->parent_fd);
        switch(cVar1) {
        case '\x01':
          privop_pasv_get_data_sock(sess);
          break;
        case '\x02':
          privop_pasv_active(sess);
          break;
        case '\x03':
          privop_pasv_listen(sess);
          break;
        case '\x04':
          privop_pasv_accept(sess);
        }
      } while( true );
    }
    perror("seteuid");
    exit(1);
  }
  perror("setegid");
  exit(1);
}

Assistant:

void handle_parent(session_t *sess) {
  struct passwd *pw = getpwnam("nobody");
  if (pw == NULL)
    return;

  if (setegid(pw->pw_gid) < 0) {
    ERR_EXIT("setegid");
  }

  if (seteuid(pw->pw_uid) < 0) {
    ERR_EXIT("seteuid");
  }

  // add cur process bind 20 port privilege
  minimize_privilege();

  char cmd;
  while (1) {
    // 读取来自子进程的数据
    cmd = priv_sock_get_cmd(sess->parent_fd);
    //printf("cmd: %d\n", (int)cmd);
    // 解析内部命令
    switch (cmd) {
      case PRIV_SOCK_GET_DATA_SOCK:privop_pasv_get_data_sock(sess);
        break;
      case PRIV_SOCK_PASV_ACTIVE:privop_pasv_active(sess);
        break;
      case PRIV_SOCK_PASV_LISTEN:privop_pasv_listen(sess);
        break;
      case PRIV_SOCK_PASV_ACCEPT:privop_pasv_accept(sess);
        break;
    }

  }
}